

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

string * __thiscall
upb::generator::(anonymous_namespace)::MessageMiniTableRef_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,MessageDefPtr descriptor,
          Options *options)

{
  char *pcVar1;
  generator *pgVar2;
  string *extraout_RAX;
  string *psVar3;
  string_view full_name;
  string_view full_name_00;
  undefined1 local_a0 [32];
  size_t local_80;
  string *local_78;
  AlphaNum local_50;
  
  if ((int)descriptor.ptr_ == 0) {
    pcVar1 = upb_MessageDef_FullName((upb_MessageDef *)this);
    pgVar2 = (generator *)strlen(pcVar1);
    full_name_00._M_str = (char *)options;
    full_name_00._M_len = (size_t)pcVar1;
    MiniTableMessageVarName_abi_cxx11_((string *)local_a0,pgVar2,full_name_00);
    local_50.piece_._M_len = local_a0._8_8_;
    local_50.piece_._M_str = (char *)local_a0._0_8_;
    local_80 = 2;
    local_78 = (string *)0x132306;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_50);
  }
  else {
    local_50.piece_._M_len = 1;
    local_50.piece_._M_str = "&";
    pcVar1 = upb_MessageDef_FullName((upb_MessageDef *)this);
    pgVar2 = (generator *)strlen(pcVar1);
    full_name._M_str = (char *)options;
    full_name._M_len = (size_t)pcVar1;
    MiniTableMessageVarName_abi_cxx11_((string *)local_a0,pgVar2,full_name);
    local_80 = local_a0._8_8_;
    local_78 = (string *)local_a0._0_8_;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_50);
  }
  psVar3 = (string *)(local_a0 + 0x10);
  if ((string *)local_a0._0_8_ != psVar3) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

std::string MessageMiniTableRef(upb::MessageDefPtr descriptor,
                                const Options& options) {
  if (options.bootstrap_stage == 0) {
    return absl::StrCat(MiniTableMessageVarName(descriptor.full_name()), "()");
  } else {
    return absl::StrCat("&", MiniTableMessageVarName(descriptor.full_name()));
  }
}